

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_light.cpp
# Opt level: O1

void __thiscall ON_Light::SetIntensity(ON_Light *this,double v)

{
  bool bVar1;
  
  bVar1 = ON_IsValid(v);
  if (bVar1) {
    this->m_intensity = (double)(~-(ulong)(v <= 0.0) & (ulong)v);
  }
  return;
}

Assistant:

void ON_Light::SetIntensity(double v)
{
  //ALB 2014.04.28
  //Fixes http://mcneel.myjetbrains.com/youtrack/issue/RH-26585
  //Lights should not be clamped to 1.0.  There is absolutely no reason to do so.
  if ( ON_IsValid(v) )
  {
    if (v <= 0.0)
      m_intensity = 0.0;
    else
      m_intensity = v;
  }
}